

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

bool __thiscall
QSslConfiguration::addCaCertificates
          (QSslConfiguration *this,QString *path,EncodingFormat format,PatternSyntax syntax)

{
  long lVar1;
  QList<QSslCertificate> *in_RDI;
  long in_FS_OFFSET;
  PatternSyntax in_stack_00000030;
  EncodingFormat in_stack_00000034;
  QList<QSslCertificate> certs;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSslCertificate::fromPath((QString *)certs.d.d,in_stack_00000034,in_stack_00000030);
  local_21 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x38e037);
  if (!local_21) {
    QSharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QSharedDataPointer<QSslConfigurationPrivate> *)in_RDI);
    QList<QSslCertificate>::operator+=
              (in_RDI,(QList<QSslCertificate> *)
                      CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  }
  local_21 = !local_21;
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x38e07e);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QSslConfiguration::addCaCertificates(const QString &path, QSsl::EncodingFormat format,
                                          QSslCertificate::PatternSyntax syntax)
{
    QList<QSslCertificate> certs = QSslCertificate::fromPath(path, format, syntax);
    if (certs.isEmpty())
        return false;

    d->caCertificates += certs;
    return true;
}